

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O0

void __thiscall jaegertracing::Config_testParse_Test::TestBody(Config_testParse_Test *this)

{
  bool bVar1;
  Config *this_00;
  string *psVar2;
  char *pcVar3;
  HeadersConfig *pHVar4;
  Node local_450;
  Config local_430;
  AssertHelper local_290 [8];
  Message local_288 [8];
  undefined1 local_280 [8];
  AssertionResult gtest_ar_4;
  Message local_268 [8];
  undefined1 local_260 [8];
  AssertionResult gtest_ar_3;
  Message local_248 [8];
  undefined1 local_240 [8];
  AssertionResult gtest_ar_2;
  Message local_228 [8];
  undefined1 local_220 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_208 [8];
  Message local_200 [8];
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  Node local_1d8;
  undefined1 local_1b8 [8];
  Config config;
  char *kConfigYAML;
  Config_testParse_Test *this_local;
  
  config._baggageRestrictions._refreshInterval.__r = (rep)anon_var_dwarf_c804;
  YAML::Load(&local_1d8.m_isValid);
  Config::parse((Config *)local_1b8,&local_1d8);
  YAML::Node::~Node(&local_1d8);
  this_00 = Config::sampler((Config *)local_1b8);
  psVar2 = samplers::Config::type_abi_cxx11_(this_00);
  testing::internal::EqHelper<false>::Compare<char[14],std::__cxx11::string>
            ((EqHelper<false> *)local_1f8,"\"probabilistic\"","config.sampler().type()",
             (char (*) [14])"probabilistic",psVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (local_208,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=(local_208,local_200);
    testing::internal::AssertHelper::~AssertHelper(local_208);
    testing::Message::~Message(local_200);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    pHVar4 = Config::headers((Config *)local_1b8);
    psVar2 = propagation::HeadersConfig::jaegerDebugHeader_abi_cxx11_(pHVar4);
    testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
              ((EqHelper<false> *)local_220,"\"debug-id\"","config.headers().jaegerDebugHeader()",
               (char (*) [9])0x35fca0,psVar2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
    if (!bVar1) {
      testing::Message::Message(local_228);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
                 ,0x39,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_228);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(local_228);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      pHVar4 = Config::headers((Config *)local_1b8);
      psVar2 = propagation::HeadersConfig::jaegerBaggageHeader_abi_cxx11_(pHVar4);
      testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
                ((EqHelper<false> *)local_240,"\"baggage\"","config.headers().jaegerBaggageHeader()"
                 ,(char (*) [8])0x35fcb0,psVar2);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
      if (!bVar1) {
        testing::Message::Message(local_248);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
                   ,0x3a,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_248);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(local_248);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        pHVar4 = Config::headers((Config *)local_1b8);
        psVar2 = propagation::HeadersConfig::traceContextHeaderName_abi_cxx11_(pHVar4);
        testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
                  ((EqHelper<false> *)local_260,"\"trace-id\"",
                   "config.headers().traceContextHeaderName()",(char (*) [9])0x35fcbd,psVar2);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
        if (!bVar1) {
          testing::Message::Message(local_268);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
                     ,0x3b,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_268)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(local_268);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          pHVar4 = Config::headers((Config *)local_1b8);
          psVar2 = propagation::HeadersConfig::traceBaggageHeaderPrefix_abi_cxx11_(pHVar4);
          testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
                    ((EqHelper<false> *)local_280,"\"testctx-\"",
                     "config.headers().traceBaggageHeaderPrefix()",(char (*) [9])"testctx-",psVar2);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
          if (!bVar1) {
            testing::Message::Message(local_288);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
            testing::internal::AssertHelper::AssertHelper
                      (local_290,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
                       ,0x3c,pcVar3);
            testing::internal::AssertHelper::operator=(local_290,local_288);
            testing::internal::AssertHelper::~AssertHelper(local_290);
            testing::Message::~Message(local_288);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            gtest_ar_1.message_.ptr_._4_4_ = 0;
          }
        }
      }
    }
  }
  Config::~Config((Config *)local_1b8);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    YAML::Load(&local_450.m_isValid);
    Config::parse(&local_430,&local_450);
    Config::~Config(&local_430);
    YAML::Node::~Node(&local_450);
  }
  return;
}

Assistant:

TEST(Config, testParse)
{
    {
        constexpr auto kConfigYAML = R"cfg(
disabled: true
traceid_128bit: true
sampler:
    type: probabilistic
    param: 0.001
reporter:
    queueSize: 100
    bufferFlushInterval: 10
    logSpans: false
    localAgentHostPort: 127.0.0.1:6831
headers:
    jaegerDebugHeader: debug-id
    jaegerBaggageHeader: baggage
    TraceContextHeaderName: trace-id
    traceBaggageHeaderPrefix: "testctx-"
baggage_restrictions:
    denyBaggageOnInitializationFailure: false
    hostPort: 127.0.0.1:5778
    refreshInterval: 60
)cfg";
        const auto config = Config::parse(YAML::Load(kConfigYAML));
        ASSERT_EQ("probabilistic", config.sampler().type());
        ASSERT_EQ("debug-id", config.headers().jaegerDebugHeader());
        ASSERT_EQ("baggage", config.headers().jaegerBaggageHeader());
        ASSERT_EQ("trace-id", config.headers().traceContextHeaderName());
        ASSERT_EQ("testctx-", config.headers().traceBaggageHeaderPrefix());
    }

    {
        Config::parse(YAML::Load(R"cfg(
disabled: false
traceid_128bit: false
sampler: 1
reporter: 2
headers: 3
baggage_restrictions: 4
)cfg"));
    }
}